

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O1

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::create
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path,Parameters *parameters)

{
  Client *client;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  Url local_40;
  
  client = this->client_;
  getUrl(&local_40,this,path);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::_Function_handler<$ff8c07cd$>::_M_invoke;
  local_58 = std::_Function_handler<$ff8c07cd$>::_M_manager;
  HttpConsumer::post(__return_storage_ptr__,client,&local_40,parameters,(JsonProducer *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.value_._M_dataplus._M_p != &local_40.value_.field_2) {
    operator_delete(local_40.value_._M_dataplus._M_p,
                    local_40.value_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::create(const Vault::Path &path, const Parameters &parameters) {
  return Vault::HttpConsumer::post(
      client_, getUrl(path), parameters, [&](const Parameters &params) {
        nlohmann::json json;
        json["data"] = helpers::create_json(params);
        return json.dump();
      });
}